

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_auth_keyboard_info_request.c
# Opt level: O3

int main(void)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  int iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  expected expected;
  int malloc_call_num;
  undefined8 uStack_38;
  
  lVar6 = 0;
  iVar5 = 1;
  iVar3 = 0;
  uStack_38 = in_RAX;
  do {
    iVar2 = test_case(iVar5,*(char **)((long)&test_cases[0].data + lVar6),
                      *(int *)((long)&test_cases[0].data_len + lVar6),(void *)0x0,
                      *(expected *)((long)&test_cases[0].expected.rc + lVar6));
    if (iVar2 != 0) {
      iVar3 = 1;
    }
    lVar6 = lVar6 + 0x20;
    iVar5 = iVar5 + 1;
  } while (lVar6 != 0x200);
  lVar6 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    uStack_38 = CONCAT44((int)lVar6 + 3,(undefined4)uStack_38);
    expected.last_error_message = failed_malloc_test_cases[lVar6].expected.last_error_message;
    expected.rc = -1;
    expected.last_error_code = -6;
    iVar5 = test_case((int)lVar6 + 0x11,"<",0x20,(void *)((long)&uStack_38 + 4),expected);
    if (iVar5 != 0) {
      iVar3 = 1;
    }
    lVar6 = 1;
    bVar1 = false;
  } while (bVar4);
  return iVar3;
}

Assistant:

int main(void)
{
    int ret = 0;
    int i;

    for(i = 0; i < TEST_CASES_LEN; i++) {
        if(test_case(i + 1,
                     test_cases[i].data,
                     test_cases[i].data_len,
                     NULL,
                     test_cases[i].expected))
            ret = 1;
    }

    for(i = 0; i < FAILED_MALLOC_TEST_CASES_LEN; i++) {
        int tc =  i + TEST_CASES_LEN + 1;
        int malloc_call_num = 3 + i;
        if(test_case(tc,
                     failed_malloc_test_cases[i].data,
                     failed_malloc_test_cases[i].data_len,
                     &malloc_call_num,
                     failed_malloc_test_cases[i].expected))
            ret = 1;
    }

    return ret;
}